

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  CURLcode CVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  char *p;
  uint uVar7;
  size_t *psVar8;
  bool bVar9;
  _Bool found_equals;
  pair array [64];
  _Bool local_439;
  size_t local_438 [129];
  
  if (query == (char *)0x0) {
    return CURLE_OK;
  }
  psVar8 = local_438;
  sVar6 = 0;
  do {
    *psVar8 = (size_t)query;
    pcVar3 = strchr(query,0x26);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(query);
      psVar8[1] = sVar4;
    }
    else {
      psVar8[1] = (long)pcVar3 - (long)query;
      psVar8 = psVar8 + 2;
      query = pcVar3 + 1;
    }
    sVar4 = sVar6 + 1;
    uVar5 = (uint)sVar6;
  } while ((pcVar3 != (char *)0x0) && (sVar6 = sVar4, uVar5 < 0x3f));
  if ((int)sVar4 == 0x40) {
    Curl_failf(data,"aws-sigv4: too many query pairs in URL");
    CVar2 = CURLE_URL_MALFORMAT;
  }
  else {
    psVar8 = local_438;
    qsort(psVar8,sVar4,0x10,compare_func);
    CVar1 = CURLE_OK;
    uVar7 = 0;
    do {
      local_439 = false;
      if (psVar8[1] != 0) {
        CVar1 = canon_string((char *)*psVar8,psVar8[1],dq,&local_439);
        if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, local_439 == false)) {
          CVar1 = Curl_dyn_addn(dq,"=",1);
        }
        if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, uVar7 < uVar5)) {
          CVar1 = Curl_dyn_addn(dq,"&",1);
        }
      }
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      psVar8 = psVar8 + 2;
      bVar9 = uVar7 < uVar5;
      CVar2 = CURLE_OK;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  return CVar2;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    const char *q = ap->p;
    bool found_equals = FALSE;
    if(!ap->len)
      continue;
    result = canon_string(q, ap->len, dq, &found_equals);
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}